

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

void __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::NodePtrComparator>
::remove<Kernel::TermList::Top>
          (SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::NodePtrComparator>
           *this,Top key)

{
  Comparison h_00;
  Comparison CVar1;
  undefined8 *in_RDI;
  Node *next;
  uint h;
  Node *left;
  uint foundHeight;
  Node *found;
  Node *node;
  uint local_44;
  Node *local_40;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Top *l;
  Node *pNVar2;
  Node *pNVar3;
  
  l = (Top *)0x0;
  local_44 = *(int *)(in_RDI + 1) - 1;
  node = (Node *)*in_RDI;
  while( true ) {
    while( true ) {
      for (; local_40 = node, node = local_40->nodes[local_44], node == (Node *)0x0;
          local_44 = local_44 - 1) {
        node = local_40;
      }
      h_00 = Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::
             SListIntermediateNode::NodePtrComparator::compare
                       (l,(Node *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (h_00 != LESS) break;
      local_44 = local_44 - 1;
      node = local_40;
    }
    if (h_00 == EQUAL) break;
    if (h_00 != GREATER) {
      node = local_40;
    }
  }
  pNVar3 = node;
  if ((((local_44 != 0) && (node->nodes[0] != (Node *)0x0)) &&
      (node->nodes[local_44] != node->nodes[0])) &&
     (pNVar2 = node,
     CVar1 = Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::
             SListIntermediateNode::NodePtrComparator::compare
                       ((Top *)node,(Node *)CONCAT44(local_44,in_stack_ffffffffffffffc8)),
     pNVar3 = pNVar2, CVar1 == EQUAL)) {
    local_44 = 0;
    while (pNVar2->nodes[0] == pNVar2->nodes[local_44 + 1]) {
      local_44 = local_44 + 1;
    }
    pNVar3 = pNVar2->nodes[0];
    local_40 = pNVar2;
  }
  while (local_40->nodes[local_44] = pNVar3->nodes[local_44], local_44 != 0) {
    local_44 = local_44 - 1;
    for (; local_40->nodes[local_44] != pNVar3; local_40 = local_40->nodes[local_44]) {
    }
  }
  deallocate(node,h_00);
  return;
}

Assistant:

void remove(Key key)
  {
    ASS(_top > 0);

    Node* found = 0; // found node
#if VDEBUG
    unsigned foundHeight = 0; // its height
#else
    unsigned foundHeight; // its height
#endif

    Node* left = _left;
    unsigned h = _top-1;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	ASS(h != 0); //this would mean that the value is not present in the list
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  ASS(h != 0);
	  h--;
	  break;

	case GREATER:
	  left = next;
	  break;

	case EQUAL:
	  found = next;
	  foundHeight = h;
	  if(h>0 && found->nodes[0] && found->nodes[h]!=found->nodes[0] &&
		  ValueComparator::compare(key,found->nodes[0]->value)==EQUAL) {
	    //The next element exists, contains the same value,
	    //and its height is lower that the height of this one.
	    //We'll rather delete that one, than the one we've found,
	    //because otherwise there'd be only low elements after a few
	    //deletions, which would degrade the skip list to linked list.
	    h=0;
	    while(found->nodes[0]==found->nodes[h+1]) {
	      h++;
	    }
	    left = found;
	    found = found->nodes[0];
	    foundHeight = h;
	  }
	  for(;;) {
	    left->nodes[h] = found->nodes[h];
	    if(h==0) {
	      break;
	    }
	    h--;
	    while(left->nodes[h]!=found) {
	      left=left->nodes[h];
	      ASS(ValueComparator::compare(key,left->value)!=LESS);
	    }
	  }

	  deallocate(found,foundHeight);
	  return;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }